

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpscheduler.cpp
# Opt level: O3

void __thiscall jrtplib::RTCPScheduler::PerformReverseReconsideration(RTCPScheduler *this)

{
  double dVar1;
  int iVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  double dVar6;
  timespec tpMono;
  timespec tpMono_1;
  timespec local_40;
  timespec local_30;
  
  if (this->firstcall == false) {
    iVar2 = this->sources->activecount;
    if (RTPTime::CurrentTime()::s_initialized == '\0') {
      RTPTime::CurrentTime()::s_initialized = '\x01';
      clock_gettime(0,&local_40);
      clock_gettime(1,&local_30);
      dVar4 = (double)local_40.tv_nsec * 1e-09 + (double)local_40.tv_sec;
      RTPTime::CurrentTime()::s_startOffet =
           dVar4 - ((double)local_30.tv_nsec * 1e-09 + (double)local_30.tv_sec);
    }
    else {
      clock_gettime(1,&local_40);
      dVar4 = (double)local_40.tv_nsec * 1e-09 + (double)local_40.tv_sec +
              RTPTime::CurrentTime()::s_startOffet;
    }
    dVar5 = (this->nextrtcptime).m_t;
    dVar6 = (double)iVar2 / (double)(int)(this->pmembers + (uint)(this->pmembers == 0));
    dVar1 = (this->prevrtcptime).m_t;
    dVar5 = dVar4 + dVar6 * (double)(-(ulong)(dVar4 < dVar5) & (ulong)(dVar5 - dVar4));
    dVar4 = dVar4 - dVar6 * (double)(-(ulong)(dVar1 < dVar4) & (ulong)(dVar4 - dVar1));
    auVar3._8_4_ = SUB84(dVar4,0);
    auVar3._0_8_ = dVar5;
    auVar3._12_4_ = (int)((ulong)dVar4 >> 0x20);
    this->nextrtcptime = (RTPTime)dVar5;
    this->prevrtcptime = (RTPTime)auVar3._8_8_;
    this->pmembers = iVar2;
  }
  return;
}

Assistant:

void RTCPScheduler::PerformReverseReconsideration()
{
	if (firstcall)
		return;
	
	double diff1,diff2;
	int members = sources.GetActiveMemberCount();
	
	RTPTime tc = RTPTime::CurrentTime();
	RTPTime tn_min_tc = nextrtcptime;

	if (tn_min_tc > tc)
		tn_min_tc -= tc;
	else
		tn_min_tc = RTPTime(0,0);

//	std::cout << "+tn_min_tc0 " << nextrtcptime.GetDouble()-tc.GetDouble() << std::endl;
//	std::cout << "-tn_min_tc0 " << -nextrtcptime.GetDouble()+tc.GetDouble() << std::endl;
//	std::cout << "tn_min_tc " << tn_min_tc.GetDouble() << std::endl;
	
	RTPTime tc_min_tp = tc;

	if (tc_min_tp > prevrtcptime)
		tc_min_tp -= prevrtcptime;
	else
		tc_min_tp = 0;
	
	if (pmembers == 0) // avoid division by zero
		pmembers++;
	
	diff1 = (((double)members)/((double)pmembers))*tn_min_tc.GetDouble();
	diff2 = (((double)members)/((double)pmembers))*tc_min_tp.GetDouble();

	nextrtcptime = tc;
	prevrtcptime = tc;
	nextrtcptime += RTPTime(diff1);
	prevrtcptime -= RTPTime(diff2);
	
	pmembers = members;
}